

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMove7<(moira::Instr)71,(moira::Mode)1,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  u32 *in_RDX;
  StrWriter *in_RSI;
  Moira *in_RDI;
  Ea<(moira::Mode)7,_(moira::Size)4> dst;
  Ea<(moira::Mode)1,_(moira::Size)4> src;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined6 in_stack_ffffffffffffffb8;
  u16 in_stack_ffffffffffffffbe;
  Moira *in_stack_ffffffffffffffc0;
  Ea<(moira::Mode)1,_(moira::Size)4> local_30;
  StrWriter *local_10;
  
  local_10 = in_RSI;
  Op<(moira::Mode)1,(moira::Size)4>(&local_30,in_RDI,in_CX & 7,in_RDX);
  Op<(moira::Mode)7,(moira::Size)4>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,
             (u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  pSVar1 = StrWriter::operator<<(local_10);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(in_RDI->tab).raw);
  pSVar1 = StrWriter::operator<<
                     ((StrWriter *)in_stack_ffffffffffffffc0,
                      (Ea<(moira::Mode)1,_(moira::Size)4> *)
                      CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)in_stack_ffffffffffffffc0,
             (Ea<(moira::Mode)7,_(moira::Size)4> *)
             CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

void
Moira::dasmMove7(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_AW,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}